

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c++
# Opt level: O2

void kj::_::inlineRequireFailure
               (char *file,int line,char *expectation,char *macroArgs,char *message)

{
  Fault f;
  Fault local_18;
  char *local_10;
  
  local_10 = message;
  if (message == (char *)0x0) {
    Debug::Fault::Fault(&local_18,file,line,FAILED,expectation,macroArgs);
    Debug::Fault::fatal(&local_18);
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const*&>
            (&local_18,file,line,FAILED,expectation,macroArgs,&local_10);
  Debug::Fault::fatal(&local_18);
}

Assistant:

void inlineRequireFailure(const char* file, int line, const char* expectation,
                          const char* macroArgs, const char* message) {
  if (message == nullptr) {
    Debug::Fault f(file, line, kj::Exception::Type::FAILED, expectation, macroArgs);
    f.fatal();
  } else {
    Debug::Fault f(file, line, kj::Exception::Type::FAILED, expectation, macroArgs, message);
    f.fatal();
  }
}